

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimPatWrite(char *pFileName,Vec_Wrd_t *vSimsIn,int nWords)

{
  FILE *__stream;
  word *pwVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int k;
  uint uVar7;
  
  iVar6 = vSimsIn->nSize / nWords;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  if (vSimsIn->nSize % nWords == 0) {
    uVar3 = nWords << 4;
    if (nWords << 4 < 1) {
      uVar3 = 0;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (iVar5 = 0; iVar5 != iVar6; iVar5 = iVar5 + 1) {
      pwVar1 = Vec_WrdEntryP(vSimsIn,iVar5 * nWords);
      bVar4 = 0;
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        uVar2 = (uint)(pwVar1[uVar7 >> 4] >> (bVar4 & 0x3c)) & 0xf;
        if (uVar2 < 10) {
          fprintf(__stream,"%d");
        }
        else {
          fputc(uVar2 + 0x37,__stream);
        }
        bVar4 = bVar4 + 4;
      }
      fputc(10,__stream);
    }
    fclose(__stream);
    return;
  }
  __assert_fail("Vec_WrdSize(p) % nWords == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x4f6,"void Vec_WrdDumpHex(char *, Vec_Wrd_t *, int, int)");
}

Assistant:

void Gia_ManSimPatWrite( char * pFileName, Vec_Wrd_t * vSimsIn, int nWords )
{
    Vec_WrdDumpHex( pFileName, vSimsIn, nWords, 0 );
}